

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

void __thiscall
duckdb::LocalFileSystem::MoveFile
          (LocalFileSystem *this,string *source,string *target,
          optional_ptr<duckdb::FileOpener,_true> opener)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  idx_t iVar4;
  idx_t iVar5;
  IOException *this_00;
  int *piVar6;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  string local_d8;
  string local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  pcVar1 = (source->_M_dataplus)._M_p;
  iVar4 = GetFileUrlOffset(source);
  pcVar2 = (target->_M_dataplus)._M_p;
  iVar5 = GetFileUrlOffset(target);
  iVar3 = rename(pcVar1 + iVar4,pcVar2 + iVar5);
  if (iVar3 == 0) {
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Could not rename file!","")
  ;
  piVar6 = __errno_location();
  std::__cxx11::to_string(&local_b8,*piVar6);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_98,(char (*) [6])"errno",&local_b8);
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_58,&local_98,&local_58,0,&local_d9,&local_da,&local_db);
  IOException::IOException(this_00,&local_d8,&local_58);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LocalFileSystem::MoveFile(const string &source, const string &target, optional_ptr<FileOpener> opener) {
	auto normalized_source = NormalizeLocalPath(source);
	auto normalized_target = NormalizeLocalPath(target);
	//! FIXME: rename does not guarantee atomicity or overwriting target file if it exists
	if (rename(normalized_source, normalized_target) != 0) {
		throw IOException("Could not rename file!", {{"errno", std::to_string(errno)}});
	}
}